

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_Server_removeRepeatedJob(UA_Server *server,UA_Guid jobId)

{
  RepeatedJob *pRVar1;
  RepeatedJob **ppRVar2;
  RepeatedJob *__ptr;
  undefined1 auVar3 [16];
  char cStack_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  UA_Guid jobId_local;
  
  pRVar1 = (server->repeatedJobs).lh_first;
  do {
    __ptr = pRVar1;
    if (__ptr == (RepeatedJob *)0x0) {
      return 0;
    }
    pRVar1 = (__ptr->next).le_next;
    cStack_18 = (char)jobId.data1;
    cStack_17 = jobId.data1._1_1_;
    cStack_16 = jobId.data1._2_1_;
    cStack_15 = jobId.data1._3_1_;
    cStack_14 = (char)jobId.data2;
    cStack_13 = jobId.data2._1_1_;
    cStack_12 = (char)jobId.data3;
    cStack_11 = jobId.data3._1_1_;
    jobId_local.data1._0_1_ = jobId.data4[0];
    jobId_local.data1._1_1_ = jobId.data4[1];
    jobId_local.data1._2_1_ = jobId.data4[2];
    jobId_local.data1._3_1_ = jobId.data4[3];
    jobId_local.data2._0_1_ = jobId.data4[4];
    jobId_local.data2._1_1_ = jobId.data4[5];
    jobId_local.data3._0_1_ = jobId.data4[6];
    jobId_local.data3._1_1_ = jobId.data4[7];
    auVar3[0] = -((char)(__ptr->id).data1 == cStack_18);
    auVar3[1] = -(*(char *)((long)&(__ptr->id).data1 + 1) == cStack_17);
    auVar3[2] = -(*(char *)((long)&(__ptr->id).data1 + 2) == cStack_16);
    auVar3[3] = -(*(char *)((long)&(__ptr->id).data1 + 3) == cStack_15);
    auVar3[4] = -((char)(__ptr->id).data2 == cStack_14);
    auVar3[5] = -(*(char *)((long)&(__ptr->id).data2 + 1) == cStack_13);
    auVar3[6] = -((char)(__ptr->id).data3 == cStack_12);
    auVar3[7] = -(*(char *)((long)&(__ptr->id).data3 + 1) == cStack_11);
    auVar3[8] = -((__ptr->id).data4[0] == (UA_Byte)jobId_local.data1);
    auVar3[9] = -((__ptr->id).data4[1] == jobId_local.data1._1_1_);
    auVar3[10] = -((__ptr->id).data4[2] == jobId_local.data1._2_1_);
    auVar3[0xb] = -((__ptr->id).data4[3] == jobId_local.data1._3_1_);
    auVar3[0xc] = -((__ptr->id).data4[4] == (UA_Byte)jobId_local.data2);
    auVar3[0xd] = -((__ptr->id).data4[5] == jobId_local.data2._1_1_);
    auVar3[0xe] = -((__ptr->id).data4[6] == (UA_Byte)jobId_local.data3);
    auVar3[0xf] = -((__ptr->id).data4[7] == jobId_local.data3._1_1_);
  } while ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar3[0xf] >> 7) << 0xf) != 0xffff);
  ppRVar2 = (__ptr->next).le_prev;
  if (pRVar1 != (RepeatedJob *)0x0) {
    (pRVar1->next).le_prev = ppRVar2;
  }
  *ppRVar2 = pRVar1;
  free(__ptr);
  return 0;
}

Assistant:

UA_StatusCode UA_Server_removeRepeatedJob(UA_Server *server, UA_Guid jobId) {
#ifdef UA_ENABLE_MULTITHREADING
    UA_Guid *idptr = UA_malloc(sizeof(UA_Guid));
    if(!idptr)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    *idptr = jobId;
    // dispatch to the mainloopjobs stack
    struct MainLoopJob *mlw = UA_malloc(sizeof(struct MainLoopJob));
    mlw->job = (UA_Job) {
        .type = UA_JOBTYPE_METHODCALL,
        .job.methodCall = {.data = idptr, .method = (void (*)(UA_Server*, void*))removeRepeatedJob}};
    cds_lfs_push(&server->mainLoopJobs, &mlw->node);
#else
    removeRepeatedJob(server, &jobId);
#endif
    return UA_STATUSCODE_GOOD;
}